

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O0

RC __thiscall
RM_FileHandle::GetFirstZeroBit(RM_FileHandle *this,char *bitmap,int size,int *location)

{
  int offset;
  int chunk;
  int i;
  int *location_local;
  int size_local;
  char *bitmap_local;
  RM_FileHandle *this_local;
  
  offset = 0;
  while( true ) {
    if (size <= offset) {
      return 0x69;
    }
    if (((int)bitmap[offset / 8] & 1 << ((byte)(offset % 8) & 0x1f)) == 0) break;
    offset = offset + 1;
  }
  *location = offset;
  return 0;
}

Assistant:

RC RM_FileHandle::GetFirstZeroBit(char *bitmap, int size, int &location){
  for(int i = 0; i < size; i++){
    int chunk = i /8;
    int offset = i - chunk*8;
    if ((bitmap[chunk] & (1 << offset)) == 0){
      location = i;
      return (0);
    }
  }
  return RM_PAGEFULL;
}